

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall GEO::Logger::~Logger(Logger *this)

{
  pointer pcVar1;
  long *plVar2;
  
  (this->super_Environment).super_Counted._vptr_Counted = (_func_int **)&PTR__Logger_001a7640;
  std::
  _Rb_tree<GEO::SmartPointer<GEO::LoggerClient>,_GEO::SmartPointer<GEO::LoggerClient>,_std::_Identity<GEO::SmartPointer<GEO::LoggerClient>_>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
  ::~_Rb_tree(&(this->clients_)._M_t);
  pcVar1 = (this->current_feature_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->current_feature_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->log_file_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->log_file_name_).field_2) {
    operator_delete(pcVar1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->log_features_exclude_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->log_features_)._M_t);
  (this->status_).super_ostream._vptr_basic_ostream = (_func_int **)0x1a7548;
  *(undefined8 *)&(this->status_).super_ostream.field_0x10 = 0x1a7570;
  plVar2 = *(long **)&(this->status_).super_ostream.field_0xf8;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  std::ios_base::~ios_base((ios_base *)&(this->status_).super_ostream.field_0x10);
  (this->err_).super_ostream._vptr_basic_ostream = (_func_int **)0x1a7548;
  *(undefined8 *)&(this->err_).super_ostream.field_0x10 = 0x1a7570;
  plVar2 = *(long **)&(this->err_).super_ostream.field_0xf8;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  std::ios_base::~ios_base((ios_base *)&(this->err_).super_ostream.field_0x10);
  (this->warn_).super_ostream._vptr_basic_ostream = (_func_int **)0x1a7548;
  *(undefined8 *)&(this->warn_).super_ostream.field_0x10 = 0x1a7570;
  plVar2 = *(long **)&(this->warn_).super_ostream.field_0xf8;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  std::ios_base::~ios_base((ios_base *)&(this->warn_).super_ostream.field_0x10);
  (this->out_).super_ostream._vptr_basic_ostream = (_func_int **)0x1a7548;
  *(undefined8 *)&(this->out_).super_ostream.field_0x10 = 0x1a7570;
  plVar2 = *(long **)&(this->out_).super_ostream.field_0xf8;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  std::ios_base::~ios_base((ios_base *)&(this->out_).super_ostream.field_0x10);
  SystemEnvironment::~SystemEnvironment((SystemEnvironment *)this);
  return;
}

Assistant:

Logger::~Logger() {
    }